

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  StackItemT<embree::NodeRefPtr<4>_> SVar4;
  StackItemT<embree::NodeRefPtr<4>_> SVar5;
  StackItemT<embree::NodeRefPtr<4>_> SVar6;
  StackItemT<embree::NodeRefPtr<4>_> SVar7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  Geometry *this;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  bool bVar20;
  uint uVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  long lVar23;
  byte bVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  long lVar26;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar39 [16];
  float fVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar46;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar54;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  float fVar64;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  fVar1 = (query->p).field_0.field_0.x;
  fVar2 = (query->p).field_0.field_0.y;
  fVar3 = (query->p).field_0.field_0.z;
  fVar64 = (context->query_radius).field_0.m128[0];
  fVar37 = (context->query_radius).field_0.m128[1];
  fVar44 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fVar62 = query->radius * query->radius;
  }
  else {
    fVar62 = (context->query_radius).field_0.m128[0];
    fVar38 = (context->query_radius).field_0.m128[1];
    fVar42 = (context->query_radius).field_0.m128[2];
    fVar62 = fVar42 * fVar42 + fVar38 * fVar38 + fVar62 * fVar62;
  }
  pSVar25 = stack + 1;
  bVar20 = false;
  do {
LAB_0056bf54:
    do {
      do {
        if (pSVar25 == stack) {
          return bVar20;
        }
        pSVar22 = pSVar25 + -1;
        pSVar25 = pSVar25 + -1;
      } while (fVar62 < (float)pSVar22->dist);
      pSVar22 = stack;
      pSVar27 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar25->ptr).ptr;
LAB_0056bf78:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if (((ulong)pSVar27 & 8) != 0) goto LAB_0056c326;
        SVar4 = pSVar27[6];
        SVar5 = pSVar27[2];
        SVar6 = pSVar27[3];
        SVar7 = pSVar27[4];
        SVar8 = pSVar27[5];
        SVar9 = pSVar27[7];
        auVar56._4_4_ = fVar1;
        auVar56._0_4_ = fVar1;
        auVar56._8_4_ = fVar1;
        auVar56._12_4_ = fVar1;
        auVar39 = maxps(auVar56,(undefined1  [16])SVar5);
        auVar39 = minps(auVar39,(undefined1  [16])SVar6);
        fVar38 = auVar39._0_4_ - fVar1;
        fVar43 = auVar39._4_4_ - fVar1;
        fVar46 = auVar39._8_4_ - fVar1;
        fVar52 = auVar39._12_4_ - fVar1;
        auVar63._4_4_ = fVar2;
        auVar63._0_4_ = fVar2;
        auVar63._8_4_ = fVar2;
        auVar63._12_4_ = fVar2;
        auVar39 = maxps(auVar63,(undefined1  [16])SVar7);
        auVar39 = minps(auVar39,(undefined1  [16])SVar8);
        fVar54 = auVar39._0_4_ - fVar2;
        fVar57 = auVar39._4_4_ - fVar2;
        fVar58 = auVar39._8_4_ - fVar2;
        fVar59 = auVar39._12_4_ - fVar2;
        auVar61._4_4_ = fVar3;
        auVar61._0_4_ = fVar3;
        auVar61._8_4_ = fVar3;
        auVar61._12_4_ = fVar3;
        auVar39 = maxps(auVar61,(undefined1  [16])SVar4);
        auVar39 = minps(auVar39,(undefined1  [16])SVar9);
        fVar42 = auVar39._0_4_ - fVar3;
        fVar45 = auVar39._4_4_ - fVar3;
        fVar51 = auVar39._8_4_ - fVar3;
        fVar53 = auVar39._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar42 * fVar42 + fVar54 * fVar54 + fVar38 * fVar38;
        tNear.field_0.v[1] = fVar45 * fVar45 + fVar57 * fVar57 + fVar43 * fVar43;
        tNear.field_0.v[2] = fVar51 * fVar51 + fVar58 * fVar58 + fVar46 * fVar46;
        tNear.field_0.v[3] = fVar53 * fVar53 + fVar59 * fVar59 + fVar52 * fVar52;
        bVar16 = (((float)SVar4.ptr.ptr <= fVar44 + fVar3 && fVar1 - fVar64 <= (float)SVar6.ptr.ptr)
                 && ((float)SVar7.ptr.ptr <= fVar37 + fVar2 &&
                    (float)SVar5.ptr.ptr <= fVar1 + fVar64)) &&
                 (fVar3 - fVar44 <= (float)SVar9.ptr.ptr &&
                 ((float)SVar5.ptr.ptr <= (float)SVar6.ptr.ptr &&
                 fVar2 - fVar37 <= (float)SVar8.ptr.ptr));
        bVar17 = ((SVar4.ptr.ptr._4_4_ <= fVar44 + fVar3 && fVar1 - fVar64 <= SVar6.ptr.ptr._4_4_)
                 && (SVar7.ptr.ptr._4_4_ <= fVar37 + fVar2 && SVar5.ptr.ptr._4_4_ <= fVar1 + fVar64)
                 ) && (fVar3 - fVar44 <= SVar9.ptr.ptr._4_4_ &&
                      (SVar5.ptr.ptr._4_4_ <= SVar6.ptr.ptr._4_4_ &&
                      fVar2 - fVar37 <= SVar8.ptr.ptr._4_4_));
        bVar15 = (((float)SVar4.dist <= fVar44 + fVar3 && fVar1 - fVar64 <= (float)SVar6.dist) &&
                 ((float)SVar7.dist <= fVar37 + fVar2 && (float)SVar5.dist <= fVar1 + fVar64)) &&
                 (fVar3 - fVar44 <= (float)SVar9.dist &&
                 ((float)SVar5.dist <= (float)SVar6.dist && fVar2 - fVar37 <= (float)SVar8.dist));
        bVar18 = ((SVar4._12_4_ <= fVar44 + fVar3 && fVar1 - fVar64 <= SVar6._12_4_) &&
                 (SVar7._12_4_ <= fVar37 + fVar2 && SVar5._12_4_ <= fVar1 + fVar64)) &&
                 (fVar3 - fVar44 <= SVar9._12_4_ &&
                 (SVar5._12_4_ <= SVar6._12_4_ && fVar2 - fVar37 <= SVar8._12_4_));
LAB_0056bfe8:
        auVar30._0_4_ = (uint)bVar16 * -0x80000000;
        auVar30._4_4_ = (uint)bVar17 * -0x80000000;
        auVar30._8_4_ = (uint)bVar15 * -0x80000000;
        auVar30._12_4_ = (uint)bVar18 * -0x80000000;
        uVar21 = movmskps((int)pSVar22,auVar30);
        if (uVar21 != 0) {
          uVar21 = uVar21 & 0xff;
          uVar28 = (ulong)pSVar27 & 0xfffffffffffffff0;
          lVar23 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          pSVar22 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar28 + lVar23 * 8);
          uVar21 = uVar21 - 1 & uVar21;
          pSVar27 = pSVar22;
          if (uVar21 != 0) {
            uVar10 = tNear.field_0.i[lVar23];
            lVar23 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            pSVar27 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar28 + lVar23 * 8);
            uVar11 = tNear.field_0.i[lVar23];
            uVar21 = uVar21 - 1 & uVar21;
            if (uVar21 == 0) {
              if (uVar10 < uVar11) {
                (pSVar25->ptr).ptr = (size_t)pSVar27;
                pSVar25->dist = uVar11;
                pSVar25 = pSVar25 + 1;
                pSVar27 = pSVar22;
              }
              else {
                (pSVar25->ptr).ptr = (size_t)pSVar22;
                pSVar25->dist = uVar10;
                pSVar22 = pSVar27;
                pSVar25 = pSVar25 + 1;
              }
            }
            else {
              auVar31._8_4_ = uVar10;
              auVar31._0_8_ = pSVar22;
              auVar31._12_4_ = 0;
              auVar34._8_4_ = uVar11;
              auVar34._0_8_ = pSVar27;
              auVar34._12_4_ = 0;
              lVar23 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              uVar14 = *(ulong *)(uVar28 + lVar23 * 8);
              iVar12 = tNear.field_0.i[lVar23];
              auVar40._8_4_ = iVar12;
              auVar40._0_8_ = uVar14;
              auVar40._12_4_ = 0;
              auVar47._8_4_ = -(uint)((int)uVar10 < (int)uVar11);
              uVar21 = uVar21 - 1 & uVar21;
              if (uVar21 == 0) {
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar39 = auVar31 & auVar47 | ~auVar47 & auVar34;
                auVar35 = auVar34 & auVar47 | ~auVar47 & auVar31;
                auVar48._8_4_ = -(uint)(auVar39._8_4_ < iVar12);
                auVar48._0_8_ = CONCAT44(auVar48._8_4_,auVar48._8_4_);
                auVar48._12_4_ = auVar48._8_4_;
                pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)
                          (~auVar48._0_8_ & uVar14 | auVar39._0_8_ & auVar48._0_8_);
                auVar39 = auVar40 & auVar48 | ~auVar48 & auVar39;
                auVar32._8_4_ = -(uint)(auVar35._8_4_ < auVar39._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                *pSVar25 = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar32 & auVar35 | auVar39 & auVar32);
                pSVar25[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (auVar35 & auVar32 | ~auVar32 & auVar39);
                pSVar25 = pSVar25 + 2;
                pSVar27 = pSVar22;
              }
              else {
                lVar23 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                iVar13 = tNear.field_0.i[lVar23];
                auVar55._8_4_ = iVar13;
                auVar55._0_8_ = *(undefined8 *)(uVar28 + lVar23 * 8);
                auVar55._12_4_ = 0;
                auVar49._4_4_ = auVar47._8_4_;
                auVar49._0_4_ = auVar47._8_4_;
                auVar49._8_4_ = auVar47._8_4_;
                auVar49._12_4_ = auVar47._8_4_;
                auVar39 = auVar31 & auVar49 | ~auVar49 & auVar34;
                auVar35 = auVar34 & auVar49 | ~auVar49 & auVar31;
                auVar60._0_4_ = -(uint)(iVar12 < iVar13);
                auVar60._4_4_ = -(uint)(iVar12 < iVar13);
                auVar60._8_4_ = -(uint)(iVar12 < iVar13);
                auVar60._12_4_ = -(uint)(iVar12 < iVar13);
                auVar50 = auVar40 & auVar60 | ~auVar60 & auVar55;
                auVar61 = ~auVar60 & auVar40 | auVar55 & auVar60;
                auVar41._8_4_ = -(uint)(auVar35._8_4_ < auVar61._8_4_);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar56 = auVar35 & auVar41 | ~auVar41 & auVar61;
                auVar36._8_4_ = -(uint)(auVar39._8_4_ < auVar50._8_4_);
                auVar36._0_8_ = CONCAT44(auVar36._8_4_,auVar36._8_4_);
                auVar36._12_4_ = auVar36._8_4_;
                pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)
                          (auVar39._0_8_ & auVar36._0_8_ | ~auVar36._0_8_ & auVar50._0_8_);
                auVar39 = ~auVar36 & auVar39 | auVar50 & auVar36;
                auVar33._8_4_ = -(uint)(auVar39._8_4_ < auVar56._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                *pSVar25 = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar41 & auVar35 | auVar61 & auVar41);
                pSVar25[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar33 & auVar39 | auVar56 & auVar33);
                pSVar25[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (auVar39 & auVar33 | ~auVar33 & auVar56);
                pSVar25 = pSVar25 + 3;
                pSVar27 = pSVar22;
              }
            }
          }
          goto LAB_0056bf78;
        }
        goto LAB_0056bf54;
      }
      if (((ulong)pSVar27 & 8) == 0) {
        SVar4 = pSVar27[2];
        SVar5 = pSVar27[3];
        auVar39._4_4_ = fVar1;
        auVar39._0_4_ = fVar1;
        auVar39._8_4_ = fVar1;
        auVar39._12_4_ = fVar1;
        auVar39 = maxps(auVar39,(undefined1  [16])SVar4);
        auVar39 = minps(auVar39,(undefined1  [16])SVar5);
        fVar38 = auVar39._0_4_ - fVar1;
        fVar42 = auVar39._4_4_ - fVar1;
        fVar43 = auVar39._8_4_ - fVar1;
        fVar45 = auVar39._12_4_ - fVar1;
        auVar35._4_4_ = fVar2;
        auVar35._0_4_ = fVar2;
        auVar35._8_4_ = fVar2;
        auVar35._12_4_ = fVar2;
        auVar39 = maxps(auVar35,(undefined1  [16])pSVar27[4]);
        auVar39 = minps(auVar39,(undefined1  [16])pSVar27[5]);
        fVar46 = auVar39._0_4_ - fVar2;
        fVar51 = auVar39._4_4_ - fVar2;
        fVar52 = auVar39._8_4_ - fVar2;
        fVar53 = auVar39._12_4_ - fVar2;
        auVar50._4_4_ = fVar3;
        auVar50._0_4_ = fVar3;
        auVar50._8_4_ = fVar3;
        auVar50._12_4_ = fVar3;
        auVar39 = maxps(auVar50,(undefined1  [16])pSVar27[6]);
        auVar39 = minps(auVar39,(undefined1  [16])pSVar27[7]);
        fVar54 = auVar39._0_4_ - fVar3;
        fVar57 = auVar39._4_4_ - fVar3;
        fVar58 = auVar39._8_4_ - fVar3;
        fVar59 = auVar39._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar54 * fVar54 + fVar46 * fVar46 + fVar38 * fVar38;
        tNear.field_0.v[1] = fVar57 * fVar57 + fVar51 * fVar51 + fVar42 * fVar42;
        tNear.field_0.v[2] = fVar58 * fVar58 + fVar52 * fVar52 + fVar43 * fVar43;
        tNear.field_0.v[3] = fVar59 * fVar59 + fVar53 * fVar53 + fVar45 * fVar45;
        bVar16 = (float)SVar4.ptr.ptr <= (float)SVar5.ptr.ptr &&
                 tNear.field_0.v[0] <= fVar64 * fVar64;
        bVar17 = SVar4.ptr.ptr._4_4_ <= SVar5.ptr.ptr._4_4_ && tNear.field_0.v[1] <= fVar64 * fVar64
        ;
        bVar15 = (float)SVar4.dist <= (float)SVar5.dist && tNear.field_0.v[2] <= fVar64 * fVar64;
        bVar18 = SVar4._12_4_ <= SVar5._12_4_ && tNear.field_0.v[3] <= fVar64 * fVar64;
        goto LAB_0056bfe8;
      }
LAB_0056c326:
      lVar29 = ((ulong)pSVar27 & 0xfffffffffffffff0) + 0xa0;
      bVar19 = 0;
      for (lVar23 = 0; lVar23 != (ulong)((uint)pSVar27 & 0xf) - 8; lVar23 = lVar23 + 1) {
        bVar24 = 0;
        for (lVar26 = -0x10; lVar26 != 0; lVar26 = lVar26 + 4) {
          uVar21 = *(uint *)(lVar29 + lVar26);
          if ((ulong)uVar21 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar21].ptr;
          context->geomID = uVar21;
          context->primID = *(uint *)(lVar29 + 0x10 + lVar26);
          bVar18 = Geometry::pointQuery(this,query,context);
          bVar24 = bVar24 | bVar18;
        }
        bVar19 = bVar19 | bVar24;
        lVar29 = lVar29 + 0xb0;
      }
    } while (bVar19 == 0);
    fVar64 = (context->query_radius).field_0.m128[0];
    fVar37 = (context->query_radius).field_0.m128[1];
    fVar44 = (context->query_radius).field_0.m128[2];
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fVar62 = query->radius * query->radius;
    }
    else {
      fVar62 = fVar44 * fVar44 + fVar37 * fVar37 + fVar64 * fVar64;
    }
    bVar20 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }